

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O0

void Abc_NtkBalanceAttach(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_1c;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkCleanCopy(pNtk);
  for (local_1c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = Abc_NtkCo(pNtk,local_1c);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    if ((pAVar2->field_6).pTemp == (void *)0x0) {
      pAVar3 = (Abc_Obj_t *)Abc_NodeFindCone_rec(pAVar2);
      (pAVar2->field_6).pCopy = pAVar3;
    }
  }
  return;
}

Assistant:

void Abc_NtkBalanceAttach( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0(pNode);
        if ( pNode->pCopy )
            continue;
        pNode->pCopy = (Abc_Obj_t *)Abc_NodeFindCone_rec( pNode );
    }
}